

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall
CMeshClosestPointMapper::AdaptedMatchFaceTC
          (CMeshClosestPointMapper *this,int count,ON_3dPoint *pPts,SamplePoint *pSamplePts,
          int tcCount,ON_3dPoint *pTcsOut,double mappingTol,bool bEqualFaceCheck,
          TcSeamlessPatchCache *patchCache)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  int iVar4;
  ON_Mesh *this_00;
  undefined8 uVar5;
  ON_3dVector delta;
  bool bVar6;
  bool bVar7;
  int pti_1;
  int iVar8;
  TcSeamlessPatch *pTVar9;
  int *piVar10;
  ON_MeshFace *this_01;
  ON_3dPoint *pOVar11;
  long lVar12;
  byte bVar13;
  ulong uVar14;
  int pti;
  ulong uVar15;
  byte bVar16;
  int pti_2;
  long lVar17;
  _func_int **pp_Var18;
  int i;
  double dVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  ON_SimpleArray<int> commonFis;
  ON_SimpleArray<int> newCommonFis;
  ON_SimpleArray<int> allFis;
  ON_3dPointArray bestTcs;
  double tol [4];
  ON_BoundingBox samplePointBbox;
  ON_SimpleArray<int> local_150;
  double local_138;
  _func_int **local_130;
  undefined1 local_128 [16];
  double local_118;
  uint local_10c;
  ON_SimpleArray<int> local_108;
  SamplePoint *local_f0;
  ON_3dPoint *local_e8;
  ON_SimpleArray<ON_3dPoint> local_e0;
  int local_c8 [4];
  ON_BoundingBox local_b8;
  long local_88;
  ON_2fPointArray *local_80;
  ON_3dVector local_78;
  ON_BoundingBox local_60;
  
  local_f0 = pSamplePts;
  local_e8 = pPts;
  ON_BoundingBox::ON_BoundingBox(&local_60);
  local_150._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  local_150.m_a = (int *)0x0;
  local_150.m_count = 0;
  local_150.m_capacity = 0;
  local_130 = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  local_108._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  local_108.m_a = (int *)0x0;
  local_108.m_count = 0;
  local_108.m_capacity = 0;
  if (0 < count) {
    uVar14 = 0;
    do {
      pOVar11 = local_e8 + uVar14;
      ON_BoundingBox::Set(&local_60,pOVar11,1);
      local_b8.m_min.x = pOVar11->x;
      local_b8.m_min.y = pOVar11->y;
      local_b8.m_min.z = pOVar11->z;
      if (-1 < (this->m_resFis).m_capacity) {
        (this->m_resFis).m_count = 0;
      }
      local_b8.m_max.x = mappingTol;
      ON_RTree::Search(this->m_pMeshFaceTree,(ON_RTreeSphere *)&local_b8,RTreeCallback,this);
      if (uVar14 == 0) {
        ON_SimpleArray<int>::operator=(&local_150,&this->m_resFis);
      }
      else {
        local_128._0_8_ = local_130;
        local_128._8_8_ = (int *)0x0;
        local_118 = 0.0;
        if ((long)local_150.m_count != 0) {
          ON_SimpleArray<int>::SetCapacity((ON_SimpleArray<int> *)local_128,(long)local_150.m_count)
          ;
          if (0 < local_150.m_count) {
            lVar17 = 0;
            lVar12 = 0;
            do {
              iVar8 = ON_SimpleArray<int>::Search
                                (&this->m_resFis,(int *)((long)local_150.m_a + lVar17));
              if (-1 < iVar8) {
                ON_SimpleArray<int>::Append
                          ((ON_SimpleArray<int> *)local_128,(int *)((long)local_150.m_a + lVar17));
              }
              lVar12 = lVar12 + 1;
              lVar17 = lVar17 + 4;
            } while (lVar12 < local_150.m_count);
          }
        }
        ON_SimpleArray<int>::operator=(&local_150,(ON_SimpleArray<int> *)local_128);
        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_128);
      }
      iVar8 = (this->m_resFis).m_count;
      if (0 < iVar8) {
        lVar12 = 0;
        do {
          iVar4 = (this->m_resFis).m_a[lVar12];
          local_128._0_4_ = iVar4;
          lVar17 = (long)local_108.m_count;
          piVar10 = local_108.m_a;
          if (0 < lVar17) {
            do {
              if (iVar4 == *piVar10) goto LAB_004e4fe0;
              lVar17 = lVar17 + -1;
              piVar10 = piVar10 + 1;
            } while (lVar17 != 0);
          }
          ON_SimpleArray<int>::Append(&local_108,(int *)local_128);
          iVar8 = (this->m_resFis).m_count;
LAB_004e4fe0:
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar8);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)count);
  }
  if (bEqualFaceCheck) {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_e0,tcCount);
    if (local_150.m_count < 1) {
      local_138 = 1.79769313486232e+308;
    }
    else {
      local_10c = tcCount - 5;
      uVar14 = (ulong)(uint)tcCount;
      local_138 = 1.79769313486232e+308;
      lVar12 = 0;
      do {
        iVar8 = local_150.m_a[lVar12];
        local_88 = lVar12;
        if (((-1 < (long)iVar8) && (0xfffffffd < local_10c)) &&
           (this_00 = this->m_mesh, iVar8 < (this_00->m_F).m_count)) {
          local_80 = this->m_tc;
          this_01 = (this_00->m_F).m_a + iVar8;
          bVar6 = ON_MeshFace::IsQuad(this_01);
          local_c8[0] = -1;
          local_c8[1] = 0xffffffff;
          local_c8[2] = 0xffffffff;
          local_c8[3] = 0xffffffff;
          local_b8.m_min.z = 1.79769313486232e+308;
          local_b8.m_max.x = 1.79769313486232e+308;
          local_b8.m_min.x = 1.79769313486232e+308;
          local_b8.m_min.y = 1.79769313486232e+308;
          local_130 = (_func_int **)((ulong)bVar6 + 3);
          pp_Var18 = (_func_int **)0x0;
          do {
            ON_Mesh::Vertex((ON_3dPoint *)local_128,this_00,this_01->vi[(long)pp_Var18]);
            uVar15 = 0;
            pOVar11 = local_e8;
            do {
              dVar19 = ON_3dPoint::DistanceTo(pOVar11,(ON_3dPoint *)local_128);
              if ((local_c8[uVar15] == -1) || (dVar19 < (&local_b8.m_min.x)[uVar15])) {
                local_c8[uVar15] = this_01->vi[(long)pp_Var18];
                (&local_b8.m_min.x)[uVar15] = dVar19;
              }
              uVar15 = uVar15 + 1;
              pOVar11 = pOVar11 + 1;
            } while (uVar14 != uVar15);
            pp_Var18 = (_func_int **)((long)pp_Var18 + 1);
          } while (pp_Var18 != local_130);
          dVar19 = 0.0;
          uVar15 = 0;
          do {
            if (local_c8[uVar15] == -1) goto LAB_004e5241;
            dVar3 = (&local_b8.m_min.x)[uVar15];
            uVar20 = SUB84(dVar3,0);
            uVar21 = (undefined4)((ulong)dVar3 >> 0x20);
            if (dVar3 <= dVar19) {
              uVar20 = SUB84(dVar19,0);
              uVar21 = (undefined4)((ulong)dVar19 >> 0x20);
            }
            uVar15 = uVar15 + 1;
            dVar19 = (double)CONCAT44(uVar21,uVar20);
          } while (uVar14 != uVar15);
          if ((double)CONCAT44(uVar21,uVar20) < mappingTol ||
              (double)CONCAT44(uVar21,uVar20) == mappingTol) {
            dVar19 = (double)CONCAT44(uVar21,uVar20);
            uVar15 = 0;
            pOVar11 = pTcsOut;
            do {
              ON_3dPoint::ON_3dPoint
                        ((ON_3dPoint *)local_128,
                         (local_80->super_ON_SimpleArray<ON_2fPoint>).m_a + local_c8[uVar15]);
              pOVar11->z = local_118;
              pOVar11->x = (double)local_128._0_8_;
              pOVar11->y = (double)local_128._8_8_;
              uVar15 = uVar15 + 1;
              pOVar11 = pOVar11 + 1;
            } while (uVar14 != uVar15);
            if ((dVar19 == 0.0) && (!NAN(dVar19))) goto LAB_004e52b7;
            if (dVar19 < local_138) {
              if (-1 < local_e0.m_capacity) {
                local_e0.m_count = 0;
              }
              ON_SimpleArray<ON_3dPoint>::Append(&local_e0,tcCount,pTcsOut);
              local_138 = dVar19;
            }
          }
        }
LAB_004e5241:
        lVar12 = local_88 + 1;
      } while (lVar12 < local_150.m_count);
    }
    if (local_138 < mappingTol) {
      if (0 < tcCount) {
        lVar12 = 0;
        do {
          *(undefined8 *)((long)&pTcsOut->z + lVar12) =
               *(undefined8 *)((long)&(local_e0.m_a)->z + lVar12);
          puVar1 = (undefined8 *)((long)&(local_e0.m_a)->x + lVar12);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pTcsOut->x + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar12 = lVar12 + 0x18;
        } while ((ulong)(uint)tcCount * 0x18 != lVar12);
      }
LAB_004e52b7:
      ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_e0);
      bVar6 = true;
      goto LAB_004e5454;
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_e0);
  }
  if (local_150.m_count < 1) {
    local_128._0_8_ = mappingTol;
    if (0 < local_108.m_count) {
      lVar12 = 0;
      bVar16 = 0;
      do {
        pTVar9 = TcSeamlessPatchCache::Get(patchCache,local_108.m_a[lVar12]);
        local_b8.m_min.x = (pTVar9->m_bbox).m_min.x;
        local_b8.m_min.y = (pTVar9->m_bbox).m_min.y;
        local_b8.m_min.z = (pTVar9->m_bbox).m_min.z;
        local_b8.m_max.x = (pTVar9->m_bbox).m_max.x;
        local_b8.m_max.y = (pTVar9->m_bbox).m_max.y;
        local_b8.m_max.z = (pTVar9->m_bbox).m_max.z;
        ON_3dVector::ON_3dVector
                  (&local_78,(double)local_128._0_8_,(double)local_128._0_8_,(double)local_128._0_8_
                  );
        delta.y = local_78.y;
        delta.x = local_78.x;
        delta.z = local_78.z;
        ON_BoundingBox::Expand(&local_b8,delta);
        bVar6 = ON_BoundingBox::Includes(&local_b8,&local_60,false);
        if (bVar6) {
          bVar6 = TcSeamlessPatch::Evaluate
                            (pTVar9,count,local_f0,(double *)local_128,tcCount,pTcsOut);
          bVar16 = bVar16 | bVar6;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_108.m_count);
      bVar6 = true;
      if (bVar16 != 0) goto LAB_004e5454;
    }
  }
  else {
    lVar12 = 0;
    bVar16 = 0;
    local_b8.m_min.x = mappingTol;
    do {
      bVar13 = bVar16;
      pTVar9 = TcSeamlessPatchCache::Get(patchCache,local_150.m_a[lVar12]);
      bVar7 = TcSeamlessPatch::Evaluate(pTVar9,count,local_f0,(double *)&local_b8,tcCount,pTcsOut);
      lVar12 = lVar12 + 1;
      bVar16 = bVar13 | bVar7;
    } while (lVar12 < local_150.m_count);
    bVar6 = true;
    if (bVar13 != 0 || bVar7) goto LAB_004e5454;
  }
  bVar6 = false;
LAB_004e5454:
  ON_SimpleArray<int>::~ON_SimpleArray(&local_108);
  ON_SimpleArray<int>::~ON_SimpleArray(&local_150);
  return bVar6;
}

Assistant:

bool AdaptedMatchFaceTC(int count, const ON_3dPoint* pPts, SamplePoint* pSamplePts, int tcCount, ON_3dPoint* pTcsOut, double mappingTol, bool bEqualFaceCheck, TcSeamlessPatchCache& patchCache) const
	{
		// This code is dummy iteration through all faces to find a matching one
		//double minTol = DBL_MAX;
		//double matchTol = DBL_MAX;
		//int matchFi = -1;
		//for (int fi = 0; fi < m_mesh.m_F.Count(); fi++)
		//{
		//  double tol = 0.0;
		//  if (MatchFace(m_mesh, m_tc, fi, mappingTol, count, pPts, pTcsOut, tol))
		//  {
		//    if (tol < matchTol)
		//    {
		//      matchFi = fi;
		//      matchTol = tol;
		//    }
		//    //return true; // Uncomment this to return here
		//  }
		//  if (tol < minTol)
		//  {
		//    minTol = tol;
		//  }
		//}

		ON_BoundingBox samplePointBbox;
		ON_SimpleArray<int> commonFis;
		ON_SimpleArray<int> allFis;
		for (int fvi = 0; fvi < count; fvi++)
		{
			samplePointBbox.Set(pPts[fvi], 1);
			ON_RTreeSphere sphere;
			sphere.m_point[0] = pPts[fvi].x;
			sphere.m_point[1] = pPts[fvi].y;
			sphere.m_point[2] = pPts[fvi].z;
			sphere.m_radius = mappingTol;
			m_resFis.SetCount(0);
			m_pMeshFaceTree->Search(&sphere, RTreeCallback, (void*)this);
			if (fvi == 0)
			{
				commonFis = m_resFis;
			}
			else
			{
				ON_SimpleArray<int> newCommonFis(commonFis.Count());
				for (int i = 0; i < commonFis.Count(); i++)
				{
					if (m_resFis.Search(commonFis[i]) >= 0)
						newCommonFis.Append(commonFis[i]);
				}
				commonFis = newCommonFis;
			}
			for (int i = 0; i < m_resFis.Count(); i++)
				AddIfNotIncluded(allFis, m_resFis[i]);
		}

    if (bEqualFaceCheck)
    {
      double bestTol = DBL_MAX;
      ON_3dPointArray bestTcs(tcCount);
      for (int i = 0; i < commonFis.Count(); i++)
      {
        double tol = 0.0;
        if (MatchFace(m_mesh, m_tc, commonFis[i], mappingTol, tcCount, pPts, pTcsOut, tol))
        {
          if (tol == 0.0)
          {
            return true;
          }
          else if (tol < bestTol)
          {
            bestTcs.SetCount(0);
            bestTcs.Append(tcCount, pTcsOut);
            bestTol = tol;
          }
        }
      }
      if (bestTol < mappingTol)
      {
        for (int pi = 0; pi < tcCount; pi++)
        {
          pTcsOut[pi] = bestTcs[pi];
        }
        return true;
      }
    }

    if (commonFis.Count() > 0)
    {
      bool bSuccess = false;
      double maxDist = mappingTol;
      for (int i = 0; i < commonFis.Count(); i++)
      {
        const TcSeamlessPatch& sp = patchCache.Get(commonFis[i]);
        if (sp.Evaluate(count, pSamplePts, maxDist, tcCount, pTcsOut))
        {
          bSuccess = true;
        }
      }
      if (bSuccess)
        return true;
    }
    else
    {
      bool bSuccess = false;
      double maxDist = mappingTol;
      for (int i = 0; i < allFis.Count(); i++)
      {
        const TcSeamlessPatch& sp = patchCache.Get(allFis[i]);
        ON_BoundingBox patchMaxDistBb(sp.BBox());
        patchMaxDistBb.Expand(ON_3dVector(maxDist, maxDist, maxDist));
        if (patchMaxDistBb.Includes(samplePointBbox))
        {
          if (sp.Evaluate(count, pSamplePts, maxDist, tcCount, pTcsOut))
          {
            bSuccess = true;
          }
        }
      }
      if (bSuccess)
        return true;
    }


		return false;
	}